

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_vertical_tiles_common
               (tgestate_t *state,tileindex_t *vistiles,supertileindex_t *maptiles,uint8_t x,
               uint8_t *window)

{
  tileindex_t tVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  tileindex_t *ptVar5;
  byte in_CL;
  byte *in_RDX;
  tileindex_t *in_RSI;
  tgestate_t *in_RDI;
  tileindex_t t_2;
  tileindex_t t_1;
  tileindex_t t;
  uint8_t iters2;
  uint8_t iters;
  uint8_t offset;
  tileindex_t *tiles;
  uint8_t x_offset;
  uint8_t *in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  tileindex_t tVar6;
  tileindex_t tVar7;
  undefined1 in_stack_ffffffffffffffc5;
  char cVar8;
  undefined1 uVar9;
  char cVar10;
  undefined7 in_stack_ffffffffffffffd0;
  byte *local_18;
  tileindex_t *local_10;
  
  bVar2 = in_CL & 3;
  bVar3 = ((in_RDI->map_position).y & 3) * '\x04' + bVar2;
  ptVar5 = supertiles[*in_RDX].tiles + bVar3;
  bVar4 = -((byte)((int)(uint)bVar3 >> 2) & 3) & 3;
  if (bVar4 == 0) {
    bVar4 = 4;
  }
  check_map_buf(in_RDI);
  local_10 = in_RSI;
  do {
    tVar7 = *ptVar5;
    *local_10 = tVar7;
    plot_tile_then_advance
              ((tgestate_t *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
               (tileindex_t)((ulong)ptVar5 >> 0x38),
               (supertileindex_t *)
               CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffffc5,
                                                      CONCAT14(tVar7,CONCAT13(
                                                  in_stack_ffffffffffffffc3,
                                                  CONCAT12(in_stack_ffffffffffffffc2,
                                                           in_stack_ffffffffffffffc0)))))),
               in_stack_ffffffffffffffb8);
    ptVar5 = ptVar5 + 4;
    local_10 = local_10 + in_RDI->columns;
    bVar4 = bVar4 - 1;
  } while (bVar4 != 0);
  local_18 = in_RDX + 7;
  cVar8 = '\x03';
  do {
    ptVar5 = supertiles[*local_18].tiles + bVar2;
    cVar10 = '\x04';
    do {
      tVar6 = *ptVar5;
      *local_10 = tVar6;
      plot_tile_then_advance
                ((tgestate_t *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
                 (tileindex_t)((ulong)ptVar5 >> 0x38),
                 (supertileindex_t *)
                 CONCAT17(bVar3,CONCAT16(cVar10,CONCAT15(cVar8,CONCAT14(tVar7,CONCAT13(tVar6,
                                                  CONCAT12(in_stack_ffffffffffffffc2,
                                                           in_stack_ffffffffffffffc0)))))),
                 in_stack_ffffffffffffffb8);
      local_10 = local_10 + in_RDI->columns;
      ptVar5 = ptVar5 + 4;
      cVar10 = cVar10 + -1;
    } while (cVar10 != '\0');
    local_18 = local_18 + 7;
    cVar8 = cVar8 + -1;
  } while (cVar8 != '\0');
  ptVar5 = supertiles[*local_18].tiles + bVar2;
  cVar8 = ((in_RDI->map_position).y & 3) + 1;
  uVar9 = 0;
  do {
    tVar1 = *ptVar5;
    *local_10 = tVar1;
    plot_tile_then_advance
              ((tgestate_t *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
               (tileindex_t)((ulong)ptVar5 >> 0x38),
               (supertileindex_t *)
               CONCAT17(bVar3,CONCAT16(cVar8,CONCAT15(uVar9,CONCAT14(tVar7,CONCAT13(tVar6,CONCAT12(
                                                  tVar1,in_stack_ffffffffffffffc0)))))),
               in_stack_ffffffffffffffb8);
    ptVar5 = ptVar5 + 4;
    local_10 = local_10 + in_RDI->columns;
    cVar8 = cVar8 + -1;
  } while (cVar8 != '\0');
  return;
}

Assistant:

void plot_vertical_tiles_common(tgestate_t             *state,
                                tileindex_t            *vistiles,
                                const supertileindex_t *maptiles,
                                uint8_t                 x,
                                uint8_t                *window)
{
  /* Conv: self_A94D removed. */

  uint8_t            x_offset;  /* was $A94D */
  const tileindex_t *tiles;     /* was HL */  // pointer into supertile
  uint8_t            offset;    /* was A */
  uint8_t            iters;     /* was A */
  uint8_t            iters2;    /* was B' */ // FUTURE: merge with 'iters'

  assert(state != NULL);
  ASSERT_TILE_BUF_PTR_VALID(vistiles);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  // assert(x);
  ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

  x_offset = x & 3; // self modify (local)

  /* Initial edge. */

  ASSERT_MAP_POSITION_VALID(state->map_position);
  offset = (state->map_position.y & 3) * 4 + x_offset;

  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[offset];
  ASSERT_SUPERTILE_PTR_VALID(tiles);

  // 0,1,2,3 => 4,3,2,1
  iters = -((offset >> 2) & 3) & 3;
  if (iters == 0)
    iters = 4; // 1..4

  check_map_buf(state);

  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

    t = *vistiles = *tiles; // A = tile index
    window = plot_tile_then_advance(state, t, maptiles, window);
    tiles += 4; // supertile stride
    vistiles += state->columns;
  }
  while (--iters);

  maptiles += 7; // move to next row

  /* Middle loop. */

  iters2 = 3;
  do
  {
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    assert(*maptiles < supertileindex__LIMIT);
    tiles = &supertiles[*maptiles].tiles[x_offset]; // self modified by $A8F6

    iters = 4;
    do
    {
      tileindex_t t; /* was A */

      ASSERT_TILE_BUF_PTR_VALID(vistiles);
      ASSERT_SUPERTILE_PTR_VALID(tiles);
      ASSERT_MAP_BUF_PTR_VALID(maptiles);
      ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

      t = *vistiles = *tiles; // A = tile index
      window = plot_tile_then_advance(state, t, maptiles, window);
      vistiles += state->columns;
      tiles += 4; // supertile stride
    }
    while (--iters);

    maptiles += 7; // move to next row
  }
  while (--iters2);

  /* Trailing edge. */

  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[x_offset]; // x_offset = read of self modified instruction
  iters = (state->map_position.y & 3) + 1;
  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

    t = *vistiles = *tiles; // A = tile index
    window = plot_tile_then_advance(state, t, maptiles, window);
    tiles += 4; // supertile stride
    vistiles += state->columns;
  }
  while (--iters);
}